

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlParser.cpp
# Opt level: O2

void __thiscall KDReports::Test::testMargins(Test *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  double local_80;
  qreal local_78;
  Report report;
  QFile file;
  qreal right;
  qreal bottom;
  qreal left;
  qreal top;
  
  QString::QString((QString *)&report,":/margins.xml");
  QFile::QFile(&file,(QString *)&report);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&report);
  bVar1 = (bool)QFile::open(&file,1);
  cVar2 = QTest::qVerify(bVar1,"file.open(QIODevice::ReadOnly)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0x58);
  if (cVar2 != '\0') {
    KDReports::Report::Report(&report,(QObject *)0x0);
    bVar1 = (bool)KDReports::Report::loadFromXML((QIODevice *)&report,(ErrorDetails *)&file);
    cVar2 = QTest::qVerify(bVar1,"report.loadFromXML(&file)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0x5a);
    if (cVar2 != '\0') {
      KDReports::Report::mainTextDocument();
      iVar3 = QTextDocument::blockCount();
      cVar2 = QTest::qCompare(iVar3,2,"doc.blockCount()","2",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                              ,0x5c);
      if (cVar2 != '\0') {
        QTextDocument::toPlainText();
        QString::QString((QString *)&left,"Title\nTest used by XmlParser.cpp");
        bVar1 = QTest::qCompare((QString *)&top,(QString *)&left,"doc.toPlainText()",
                                "QString(\"Title\\nTest used by XmlParser.cpp\")",
                                "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                ,0x5d);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&left);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&top);
        if (bVar1) {
          KDReports::Report::getMargins((double *)&report,&top,&left,&bottom);
          local_78 = top;
          local_80 = 40.0;
          cVar2 = QTest::qCompare(&local_78,&local_80,"static_cast<double>(top)","40.0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                  ,99);
          if (cVar2 != '\0') {
            local_78 = left;
            local_80 = 0.0;
            cVar2 = QTest::qCompare(&local_78,&local_80,"static_cast<double>(left)","0.0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                    ,100);
            if (cVar2 != '\0') {
              local_78 = right;
              local_80 = 20.0;
              cVar2 = QTest::qCompare(&local_78,&local_80,"static_cast<double>(right)","20.0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                      ,0x65);
              if (cVar2 != '\0') {
                local_78 = bottom;
                local_80 = 20.0;
                QTest::qCompare(&local_78,&local_80,"static_cast<double>(bottom)","20.0",
                                "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                ,0x66);
              }
            }
          }
        }
      }
    }
    KDReports::Report::~Report(&report);
  }
  QFile::~QFile(&file);
  return;
}

Assistant:

void testMargins()
    {
        QFile file(":/margins.xml");
        QVERIFY(file.open(QIODevice::ReadOnly));
        Report report;
        QVERIFY(report.loadFromXML(&file));
        const QTextDocument &doc = *report.mainTextDocument();
        QCOMPARE(doc.blockCount(), 2);
        QCOMPARE(doc.toPlainText(), QString("Title\nTest used by XmlParser.cpp"));
        qreal top;
        qreal left;
        qreal bottom;
        qreal right;
        report.getMargins(&top, &left, &bottom, &right);
        QCOMPARE(static_cast<double>(top), 40.0);
        QCOMPARE(static_cast<double>(left), 0.0);
        QCOMPARE(static_cast<double>(right), 20.0);
        QCOMPARE(static_cast<double>(bottom), 20.0);
    }